

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O0

int32_t count_greater(uint16_t *array,int32_t lenarray,uint16_t ikey)

{
  int32_t iVar1;
  uint16_t in_DX;
  int in_ESI;
  uint16_t *in_RDI;
  int32_t pos;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = binarySearch(in_RDI,in_ESI,in_DX);
    if (iVar1 < 0) {
      local_4 = in_ESI - (-1 - iVar1);
    }
    else {
      local_4 = in_ESI - (iVar1 + 1);
    }
  }
  return local_4;
}

Assistant:

static inline int32_t count_greater(const uint16_t *array, int32_t lenarray,
                                    uint16_t ikey) {
    if (lenarray == 0) return 0;
    int32_t pos = binarySearch(array, lenarray, ikey);
    if (pos >= 0) {
        return lenarray - (pos + 1);
    } else {
        return lenarray - (-pos - 1);
    }
}